

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_editor.cpp
# Opt level: O3

int main(void)

{
  FILE *__stream;
  int fd_in;
  int fd_out;
  size_t __size;
  char *__ptr;
  uint uVar1;
  undefined1 local_40d0 [8];
  cmd_obj O_cmd;
  long local_70 [2];
  undefined1 local_60 [8];
  editor editor;
  
  fd_in = fileno(_stdin);
  fd_out = fileno(_stdout);
  local_60 = (undefined1  [8])libchars::terminal_driver::initialize(fd_in,fd_out);
  uVar1 = 0;
  editor.driver = (terminal_driver *)0x0;
  editor.obj._0_4_ = 0;
  editor.seq[8] = '\0';
  editor.seq[9] = '\0';
  editor.seq[10] = '\0';
  editor.seq[0xb] = '\0';
  editor.seq[0xc] = '\0';
  editor.seq[0xd] = '\0';
  editor.seq[0xe] = '\0';
  editor.seq[0xf] = '\0';
  libchars::edit_object::edit_object((edit_object *)local_40d0,MODE_COMMAND,"hello");
  local_40d0 = (undefined1  [8])&PTR__edit_object_00104c58;
  std::__cxx11::string::_M_replace
            ((ulong)&O_cmd.super_edit_object.mode,0,O_cmd.super_edit_object.prompt._M_dataplus._M_p,
             0x103017);
  while( true ) {
    do {
      libchars::editor::edit((edit_object *)local_60,(ulong)local_40d0);
      __stream = _stdout;
    } while (editor.obj._4_4_ == 0x10);
    if (editor.obj._4_4_ != 0xc) break;
    if (1 < uVar1) {
      __ptr = "\n[COMPLETE]\n";
      __size = 0xc;
LAB_001023de:
      fwrite(__ptr,__size,1,_stdout);
LAB_001023e8:
      libchars::edit_object::~edit_object((edit_object *)local_40d0);
      return 0;
    }
    uVar1 = uVar1 + 1;
    if ((ulong)O_cmd.super_edit_object.buffer._16376_8_ < 0x3fff) {
      if ((ulong)O_cmd.super_edit_object.prompt.field_2._8_8_ <=
          (ulong)O_cmd.super_edit_object.buffer._16376_8_ &&
          O_cmd.super_edit_object.buffer._16376_8_ - O_cmd.super_edit_object.prompt.field_2._8_8_ !=
          0) {
        memmove(O_cmd.super_edit_object.buffer + O_cmd.super_edit_object.prompt.field_2._8_8_ + -7,
                O_cmd.super_edit_object.buffer + O_cmd.super_edit_object.prompt.field_2._8_8_ + -8,
                O_cmd.super_edit_object.buffer._16376_8_ -
                O_cmd.super_edit_object.prompt.field_2._8_8_);
      }
      O_cmd.super_edit_object.buffer[O_cmd.super_edit_object.prompt.field_2._8_8_ + -8] = 'X';
      O_cmd.super_edit_object.prompt.field_2._8_8_ =
           O_cmd.super_edit_object.prompt.field_2._8_8_ + 1;
      O_cmd.super_edit_object.buffer._16376_8_ = O_cmd.super_edit_object.buffer._16376_8_ + 1;
    }
  }
  if (editor.obj._4_4_ == 0xd) {
    cmd_obj::value_abi_cxx11_
              ((string *)&O_cmd.super_edit_object.prompt_rendered,(cmd_obj *)local_40d0);
    fprintf(__stream,"\n%s\n",O_cmd.super_edit_object.prompt_rendered);
    if ((long *)O_cmd.super_edit_object.prompt_rendered != local_70) {
      operator_delete((void *)O_cmd.super_edit_object.prompt_rendered,local_70[0] + 1);
    }
    goto LAB_001023e8;
  }
  __ptr = "\n[TERMINATE]\n";
  __size = 0xd;
  goto LAB_001023de;
}

Assistant:

int main(void)
{
    libchars::terminal_driver &tdriver = libchars::terminal_driver::initialize();
    libchars::editor editor(tdriver);

    int tabs = 0;
    cmd_obj O_cmd("hello");
    O_cmd.prompt = "PROMPT:";

    while (true) {
        (void)editor.edit(O_cmd);
        switch (editor.key()) {
        case libchars::KEY_ENTER:
            fprintf(stdout,"\n%s\n",O_cmd.value().c_str());
            return 0;
        case libchars::KEY_TAB:
            if (++tabs > 2) {
                fprintf(stdout,"\n[COMPLETE]\n");
                return 0;
            }
            else {
                O_cmd.insert('X');
            }
            break;
        case libchars::KEY_HELP:
            //ignore
            break;
        default:
            fprintf(stdout,"\n[TERMINATE]\n");
            return 0;
        }
    }

    return 0;
}